

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,bool qualified)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *name;
  long lVar2;
  cpp *pcVar3;
  cpp *pcVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined8 uVar9;
  string inner_name;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pcVar3 = this;
  do {
    pcVar4 = pcVar3;
    pcVar3 = *(cpp **)(pcVar4 + 0x18);
  } while (*(cpp **)(pcVar4 + 0x18) != (cpp *)0x0);
  name = *(string **)(pcVar4 + 8);
  std::__cxx11::string::substr((ulong)&local_60,*(ulong *)(this + 8));
  if ((char)descriptor == '\0') {
    puVar7 = *(ulong **)pcVar4;
    anon_unknown_0::DotsToUnderscores(&local_a0,&local_60);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,*puVar7);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_40.field_2._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
    local_40._M_dataplus._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0020e9fa;
  }
  else {
    anon_unknown_0::DotsToColons(&local_40,name);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x380f0c);
    paVar1 = &local_a0.field_2;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_a0.field_2._M_allocated_capacity = *puVar7;
      local_a0.field_2._8_8_ = plVar5[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *puVar7;
      local_a0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_a0._M_string_length = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    anon_unknown_0::DotsToUnderscores(&local_80,&local_60);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      uVar9 = local_a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_80._M_string_length + local_a0._M_string_length) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        uVar9 = local_80.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_80._M_string_length + local_a0._M_string_length) goto LAB_0020e914;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_80,0,(char *)0x0,(ulong)local_a0._M_dataplus._M_p);
    }
    else {
LAB_0020e914:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = puVar6 + 2;
    if ((size_type *)*puVar6 == psVar8) {
      uVar9 = puVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = puVar6[1];
    *puVar6 = psVar8;
    puVar6[1] = 0;
    *(undefined1 *)psVar8 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_0020e9fa;
  }
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
LAB_0020e9fa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Descriptor* descriptor, bool qualified) {

  // Find "outer", the descriptor of the top-level message in which
  // "descriptor" is embedded.
  const Descriptor* outer = descriptor;
  while (outer->containing_type() != NULL) outer = outer->containing_type();

  const string& outer_name = outer->full_name();
  string inner_name = descriptor->full_name().substr(outer_name.size());

  if (qualified) {
    return "::" + DotsToColons(outer_name) + DotsToUnderscores(inner_name);
  } else {
    return outer->name() + DotsToUnderscores(inner_name);
  }
}